

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O3

Vector * __thiscall
chrono::ChLinkClearance::Get_contact_P_abs(Vector *__return_storage_ptr__,ChLinkClearance *this)

{
  ChMarker *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  Vector local_38;
  
  pCVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  dVar2 = DAT_00b689a8;
  auVar3 = _VNULL;
  if (pCVar1 != (ChMarker *)0x0) {
    Get_contact_N_abs(&local_38,this);
    dVar2 = this->diameter * 0.5 + this->clearance;
    auVar3._0_8_ = dVar2 * local_38.m_data[0];
    auVar3._8_8_ = dVar2 * local_38.m_data[1];
    auVar3 = vsubpd_avx(*(undefined1 (*) [16])
                         (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data,auVar3);
    dVar2 = (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data[2] -
            dVar2 * local_38.m_data[2];
  }
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar3;
  __return_storage_ptr__->m_data[2] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

Vector ChLinkClearance::Get_contact_P_abs() {
    if (!this->GetMarker2())
        return VNULL;
    return Vadd(this->GetMarker2()->GetAbsCoord().pos,
                Vmul(this->Get_contact_N_abs(), -(this->clearance + this->diameter / 2)));
}